

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_test.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::price::subject::SubjectTest_test_compare_symbol_is_less_than_Test::TestBody
          (SubjectTest_test_compare_symbol_is_less_than_Test *this)

{
  char *pcVar1;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  AssertHelper local_60;
  AssertionResult gtest_ar;
  Subject s2;
  Subject s1;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"Currency=GBP,Symbol=EURGBP",(allocator<char> *)&s2);
  bidfx_public_api::price::subject::SubjectUtils::CreateSubjectFromString((string *)&s1);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"Currency=GBP,Symbol=BAKGBP",(allocator<char> *)&local_68);
  bidfx_public_api::price::subject::SubjectUtils::CreateSubjectFromString((string *)&s2);
  std::__cxx11::string::~string((string *)&gtest_ar);
  local_68.ptr_._0_4_ = bidfx_public_api::price::subject::Subject::Compare(&s1);
  local_60.data_._0_4_ = 0;
  testing::internal::CmpHelperGT<int,int>
            ((internal *)&gtest_ar,"s1.Compare(s2)","0",(int *)&local_68,(int *)&local_60);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_68);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subject/subject_test.cpp"
               ,0x2a,pcVar1);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_68);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_68.ptr_._0_4_ = bidfx_public_api::price::subject::Subject::Compare(&s2);
  local_60.data_._0_4_ = 0;
  testing::internal::CmpHelperLT<int,int>
            ((internal *)&gtest_ar,"s2.Compare(s1)","0",(int *)&local_68,(int *)&local_60);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_68);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subject/subject_test.cpp"
               ,0x2b,pcVar1);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_68);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&s2);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&s1);
  return;
}

Assistant:

TEST(SubjectTest, test_compare_symbol_is_less_than)
{
    Subject s1 = SubjectUtils::CreateSubjectFromString("Currency=GBP,Symbol=EURGBP");
    Subject s2 = SubjectUtils::CreateSubjectFromString("Currency=GBP,Symbol=BAKGBP");
    EXPECT_GT(s1.Compare(s2), 0);
    EXPECT_LT(s2.Compare(s1), 0);
}